

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O1

void poly1305_donna::poly1305_finish(poly1305_context *st,uchar *mac)

{
  uint32_t uVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = st->leftover;
  if (sVar3 != 0) {
    st->buffer[sVar3] = '\x01';
    if (sVar3 + 1 < 0x10) {
      memset(st->buffer + sVar3 + 1,0,0xf - sVar3);
    }
    st->final = '\x01';
    poly1305_blocks(st,st->buffer,0x10);
  }
  uVar5 = (st->h[1] >> 0x1a) + st->h[2];
  uVar8 = (uVar5 >> 0x1a) + st->h[3];
  uVar5 = uVar5 & 0x3ffffff;
  uVar9 = uVar8 & 0x3ffffff;
  uVar11 = (uVar8 >> 0x1a) + st->h[4];
  uVar13 = (uVar11 >> 0x1a) * 5 + st->h[0];
  uVar12 = (uVar13 >> 0x1a) + (st->h[1] & 0x3ffffff);
  uVar13 = uVar13 & 0x3ffffff;
  uVar8 = uVar13 + 5;
  uVar14 = (uVar8 >> 0x1a) + uVar12;
  uVar15 = (uVar14 >> 0x1a) + uVar5;
  uVar16 = (uVar15 >> 0x1a) + uVar9;
  uVar17 = uVar16 >> 0x1a;
  uVar4 = (int)((uVar11 & 0x3ffffff) + uVar17 + -0x4000000) >> 0x1f;
  uVar10 = 0xffffffff - uVar4 & 0x3ffffff;
  uVar12 = uVar12 & uVar4 | uVar14 & uVar10;
  uVar5 = uVar5 & uVar4 | uVar15 & uVar10;
  uVar9 = uVar9 & uVar4 | uVar10 & uVar16;
  uVar10 = uVar12 << 0x1a | uVar13 & uVar4 | uVar8 & uVar10;
  uVar6 = (ulong)st->pad[1] + (ulong)(uVar5 << 0x14 | uVar12 >> 6) +
          (ulong)CARRY4(uVar10,st->pad[0]);
  uVar8 = st->pad[2];
  uVar1 = st->pad[3];
  *(uint *)mac = uVar10 + st->pad[0];
  *(int *)(mac + 4) = (int)uVar6;
  lVar7 = (uVar6 >> 0x20) + (ulong)uVar8 + (ulong)(uVar9 << 0xe | uVar5 >> 0xc);
  *(int *)(mac + 8) = (int)lVar7;
  *(uint *)(mac + 0xc) =
       (int)((ulong)lVar7 >> 0x20) +
       ((uVar4 & uVar11 | 0xffffffff - uVar4 & uVar17 + (uVar11 & 0x3ffffff)) << 8 | uVar9 >> 0x12)
       + uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    st->h[3] = 0;
    st->h[4] = 0;
    st->pad[0] = 0;
    st->pad[1] = 0;
    *(undefined8 *)(st->r + 4) = 0;
    st->h[1] = 0;
    st->h[2] = 0;
    st->r[0] = 0;
    st->r[1] = 0;
    st->r[2] = 0;
    st->r[3] = 0;
    st->pad[2] = 0;
    st->pad[3] = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void poly1305_finish(poly1305_context *st, unsigned char mac[16]) noexcept {
    uint32_t h0,h1,h2,h3,h4,c;
    uint32_t g0,g1,g2,g3,g4;
    uint64_t f;
    uint32_t mask;

    /* process the remaining block */
    if (st->leftover) {
        size_t i = st->leftover;
        st->buffer[i++] = 1;
        for (; i < POLY1305_BLOCK_SIZE; i++) {
            st->buffer[i] = 0;
        }
        st->final = 1;
        poly1305_blocks(st, st->buffer, POLY1305_BLOCK_SIZE);
    }

    /* fully carry h */
    h0 = st->h[0];
    h1 = st->h[1];
    h2 = st->h[2];
    h3 = st->h[3];
    h4 = st->h[4];

                 c = h1 >> 26; h1 = h1 & 0x3ffffff;
    h2 +=     c; c = h2 >> 26; h2 = h2 & 0x3ffffff;
    h3 +=     c; c = h3 >> 26; h3 = h3 & 0x3ffffff;
    h4 +=     c; c = h4 >> 26; h4 = h4 & 0x3ffffff;
    h0 += c * 5; c = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     c;

    /* compute h + -p */
    g0 = h0 + 5; c = g0 >> 26; g0 &= 0x3ffffff;
    g1 = h1 + c; c = g1 >> 26; g1 &= 0x3ffffff;
    g2 = h2 + c; c = g2 >> 26; g2 &= 0x3ffffff;
    g3 = h3 + c; c = g3 >> 26; g3 &= 0x3ffffff;
    g4 = h4 + c - (1UL << 26);

    /* select h if h < p, or h + -p if h >= p */
    mask = (g4 >> ((sizeof(uint32_t) * 8) - 1)) - 1;
    g0 &= mask;
    g1 &= mask;
    g2 &= mask;
    g3 &= mask;
    g4 &= mask;
    mask = ~mask;
    h0 = (h0 & mask) | g0;
    h1 = (h1 & mask) | g1;
    h2 = (h2 & mask) | g2;
    h3 = (h3 & mask) | g3;
    h4 = (h4 & mask) | g4;

    /* h = h % (2^128) */
    h0 = ((h0      ) | (h1 << 26)) & 0xffffffff;
    h1 = ((h1 >>  6) | (h2 << 20)) & 0xffffffff;
    h2 = ((h2 >> 12) | (h3 << 14)) & 0xffffffff;
    h3 = ((h3 >> 18) | (h4 <<  8)) & 0xffffffff;

    /* mac = (h + pad) % (2^128) */
    f = (uint64_t)h0 + st->pad[0]            ; h0 = (uint32_t)f;
    f = (uint64_t)h1 + st->pad[1] + (f >> 32); h1 = (uint32_t)f;
    f = (uint64_t)h2 + st->pad[2] + (f >> 32); h2 = (uint32_t)f;
    f = (uint64_t)h3 + st->pad[3] + (f >> 32); h3 = (uint32_t)f;

    WriteLE32(mac +  0, h0);
    WriteLE32(mac +  4, h1);
    WriteLE32(mac +  8, h2);
    WriteLE32(mac + 12, h3);

    /* zero out the state */
    st->h[0] = 0;
    st->h[1] = 0;
    st->h[2] = 0;
    st->h[3] = 0;
    st->h[4] = 0;
    st->r[0] = 0;
    st->r[1] = 0;
    st->r[2] = 0;
    st->r[3] = 0;
    st->r[4] = 0;
    st->pad[0] = 0;
    st->pad[1] = 0;
    st->pad[2] = 0;
    st->pad[3] = 0;
}